

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn_lex.cpp
# Opt level: O0

string * __thiscall util::Lexer::ReadValue_abi_cxx11_(string *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  function<bool_(char)> local_50;
  undefined1 local_1a;
  char local_19;
  Lexer *pLStack_18;
  char c;
  Lexer *this_local;
  string *s;
  
  local_19 = '\0';
  local_1a = 0;
  pLStack_18 = this;
  this_local = (Lexer *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  GetChar(this,&local_19);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_19);
  while( true ) {
    std::function<bool(char)>::function<bool(&)(char),void>
              ((function<bool(char)> *)&local_50,ctype_value);
    bVar1 = GetCharIf(this,&local_19,&local_50);
    std::function<bool_(char)>::~function(&local_50);
    if (!bVar1) break;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::ReadValue()
	{
		char c = '\0';
		std::string s;

		this->GetChar(c);
		s += c;

		while (this->GetCharIf(c, ctype_value))
		{
			s += c;
		}

		return s;
	}